

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

void __thiscall
llm_graph_input_pos_bucket_kv::set_input(llm_graph_input_pos_bucket_kv *this,llama_ubatch *ubatch)

{
  uint uVar1;
  long lVar2;
  int32_t iVar3;
  ulong uVar4;
  byte *in_RSI;
  long in_RDI;
  undefined1 unaff_retaddr;
  uint64_t in_stack_00000008;
  llama_pos in_stack_00000010;
  int i;
  int j;
  int h;
  int64_t n_kv;
  int32_t *data;
  int64_t n_tokens;
  int local_34;
  int local_30;
  int local_2c;
  
  if (*(long *)(in_RDI + 8) != 0) {
    uVar1 = *(uint *)(in_RSI + 4);
    uVar4 = ggml_backend_buffer_is_host(*(undefined8 *)(*(long *)(in_RDI + 8) + 8));
    if ((uVar4 & 1) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x65,"GGML_ASSERT(%s) failed","ggml_backend_buffer_is_host(pos_bucket->buffer)");
    }
    if ((*in_RSI & 1) != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x66,"GGML_ASSERT(%s) failed","!ubatch->equal_seqs");
    }
    lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0xf8);
    uVar4 = (ulong)*(uint *)(*(long *)(in_RDI + 0x18) + 0x74);
    for (local_2c = 0; local_2c < 1; local_2c = local_2c + 1) {
      for (local_30 = 0; (long)local_30 < (long)(ulong)uVar1; local_30 = local_30 + 1) {
        for (local_34 = 0; (long)local_34 < (long)uVar4; local_34 = local_34 + 1) {
          std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                    ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                     (*(long *)(in_RDI + 0x18) + 0x78),(long)local_34);
          iVar3 = llama_relative_position_bucket
                            (i,in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
          *(int32_t *)
           (lVar2 + ((long)local_2c * uVar4 * uVar1 + (long)local_30 * uVar4 + (long)local_34) * 4)
               = iVar3;
        }
      }
    }
  }
  return;
}

Assistant:

void llm_graph_input_pos_bucket_kv::set_input(const llama_ubatch * ubatch) {
    if (pos_bucket) {
        const int64_t n_tokens = ubatch->n_tokens;

        GGML_ASSERT(ggml_backend_buffer_is_host(pos_bucket->buffer));
        GGML_ASSERT(!ubatch->equal_seqs); // TODO: use ubatch->n_seqs instead of failing

        int32_t * data = (int32_t *) pos_bucket->data;

        const int64_t n_kv = kv_self->n;

        for (int h = 0; h < 1; ++h) {
            for (int j = 0; j < n_tokens; ++j) {
                for (int i = 0; i < n_kv; ++i) {
                    data[h*(n_kv*n_tokens) + j*n_kv + i] = llama_relative_position_bucket(kv_self->cells[i].pos, ubatch->pos[j], hparams.n_rel_attn_bkts, false);
                }
            }
        }
    }
}